

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArrayTextureSizeTFTessControlShader::deleteProgram
          (TextureCubeMapArrayTextureSizeTFTessControlShader *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TextureCubeMapArrayTextureSizeTFBase).
             super_TextureCubeMapArrayTextureSizeBase.super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (*(int *)&(this->super_TextureCubeMapArrayTextureSizeTFBase).field_0x2c4 != 0) {
    (**(code **)(lVar2 + 0x470))();
    *(undefined4 *)&(this->super_TextureCubeMapArrayTextureSizeTFBase).field_0x2c4 = 0;
  }
  if (this->m_tcs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_tcs_id = 0;
  }
  if (this->m_tes_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_tes_id = 0;
  }
  if (this->m_fs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_fs_id = 0;
  }
  return;
}

Assistant:

void TextureCubeMapArrayTextureSizeTFTessControlShader::deleteProgram(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Delete shader objects */
	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);
		m_vs_id = 0;
	}

	if (m_tcs_id != 0)
	{
		gl.deleteShader(m_tcs_id);
		m_tcs_id = 0;
	}

	if (m_tes_id != 0)
	{
		gl.deleteShader(m_tes_id);
		m_tes_id = 0;
	}

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);
		m_fs_id = 0;
	}
}